

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

void anon_unknown.dwarf_4a352b::cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pcVar8;
  undefined8 uStack_28;
  
  pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar6 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar8;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    uVar3 = 1;
    uVar7 = 0;
    do {
      cVar1 = pcVar8[uVar5];
      uVar5 = (ulong)uVar3;
      if ((cVar1 != '\0') && (((cVar1 != '\r' || (uVar6 <= uVar5)) || (pcVar8[uVar5] != '\n')))) {
        pcVar8[uVar7] = cVar1;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar8;
      uVar3 = uVar3 + 1;
    } while (uVar5 < uVar6);
  }
  uStack_28 = in_RAX;
  if (strip_trailing_whitespace && (int)uVar7 != 0) {
    do {
      bVar2 = pcVar8[uVar7 - 1];
      iVar4 = isspace((uint)bVar2);
      if (((iVar4 == 0) && (bVar2 != 0xd)) && (bVar2 != 10)) goto LAB_0020b240;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
  }
LAB_0020b240:
  std::vector<char,_std::allocator<char>_>::resize(output,uVar7 & 0xffffffff);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (output,(char *)((long)&uStack_28 + 7));
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}